

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DistWeightSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistWeightSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  DistWeightSyntax *pDVar6;
  
  pDVar6 = (DistWeightSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DistWeightSyntax *)this->endPtr < pDVar6 + 1) {
    pDVar6 = (DistWeightSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pDVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pDVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar6->super_SyntaxNode).kind = DistWeight;
  (pDVar6->op).kind = TVar2;
  (pDVar6->op).field_0x2 = uVar3;
  (pDVar6->op).numFlags = (NumericTokenFlags)NVar4.raw;
  (pDVar6->op).rawLen = uVar5;
  (pDVar6->op).info = pIVar1;
  (pDVar6->expr).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pDVar6->super_SyntaxNode;
  return pDVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }